

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O0

BOOL expr_list_any_are_unsigned(List *ls,ByteOrder hint,ExprInfo *field_info)

{
  ExprInfo EVar1;
  BOOL local_40;
  ExprInfo info;
  ExprInfo *field_info_local;
  ListStruct *pLStack_18;
  ByteOrder hint_local;
  List *ls_local;
  
  pLStack_18 = ls;
  while( true ) {
    if (pLStack_18 == (List *)0x0) {
      return FALSE;
    }
    EVar1 = expr_info(pLStack_18,hint,field_info);
    local_40 = EVar1.sgnd;
    if (local_40 == FALSE) break;
    pLStack_18 = pLStack_18->cdr;
  }
  return TRUE;
}

Assistant:

static BOOL
expr_list_any_are_unsigned (List *ls, ByteOrder hint, ExprInfo *field_info)
{
  for (; ls != NULL; ls = ls->cdr)
    {
      ExprInfo info = expr_info (ls, hint, field_info);
      if (!info.sgnd)
	return TRUE;
    }
  return FALSE;
}